

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

HAnimHierarchy *
rw::HAnimHierarchy::create
          (int32 numNodes,int32 *nodeFlags,int32 *nodeIDs,int32 flags,int32 maxKeySize)

{
  int iVar1;
  HAnimHierarchy *pHVar2;
  AnimInterpolator *pAVar3;
  void *pvVar4;
  HAnimNodeInfo *pHVar5;
  Frame **ppFVar6;
  long lVar7;
  int32 iVar8;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 33";
  pHVar2 = (HAnimHierarchy *)(*Engine::memfuncs)(0x38,0x3011e);
  if (pHVar2 == (HAnimHierarchy *)0x0) {
    create();
    pHVar2 = (HAnimHierarchy *)0x0;
  }
  else {
    pAVar3 = AnimInterpolator::create(numNodes,maxKeySize);
    pHVar2->interpolator = pAVar3;
    pHVar2->numNodes = numNodes;
    pHVar2->flags = flags;
    pHVar2->parentFrame = (Frame *)0x0;
    pHVar2->parentHierarchy = pHVar2;
    if ((flags & 2U) == 0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 48"
      ;
      pvVar4 = (void *)(*DAT_00148858)((long)(int)(numNodes << 6 | 0xf),0x3011e);
      pHVar2->matricesUnaligned = pvVar4;
      pHVar2->matrices = (Matrix *)((long)pvVar4 + 0xfU & 0xfffffffffffffff0);
    }
    else {
      pHVar2->matrices = (Matrix *)0x0;
      pHVar2->matricesUnaligned = (void *)0x0;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 52"
    ;
    pHVar5 = (HAnimNodeInfo *)(*DAT_00148858)((long)pHVar2->numNodes * 0x18,0x3011e);
    pHVar2->nodeInfo = pHVar5;
    iVar1 = pHVar2->numNodes;
    if (0 < (long)iVar1) {
      ppFVar6 = &pHVar5->frame;
      lVar7 = 0;
      do {
        iVar8 = 0;
        if (nodeIDs != (int32 *)0x0) {
          iVar8 = nodeIDs[lVar7];
        }
        ((HAnimNodeInfo *)(ppFVar6 + -2))->id = iVar8;
        *(int32 *)((long)ppFVar6 + -0xc) = (int32)lVar7;
        if (nodeFlags == (int32 *)0x0) {
          iVar8 = 0;
        }
        else {
          iVar8 = nodeFlags[lVar7];
        }
        *(int32 *)(ppFVar6 + -1) = iVar8;
        *ppFVar6 = (Frame *)0x0;
        lVar7 = lVar7 + 1;
        ppFVar6 = ppFVar6 + 3;
      } while (iVar1 != lVar7);
    }
  }
  return pHVar2;
}

Assistant:

HAnimHierarchy*
HAnimHierarchy::create(int32 numNodes, int32 *nodeFlags, int32 *nodeIDs,
                       int32 flags, int32 maxKeySize)
{
	HAnimHierarchy *hier = (HAnimHierarchy*)rwMalloc(sizeof(*hier), MEMDUR_EVENT | ID_HANIM);
	if(hier == nil){
		RWERROR((ERR_ALLOC, sizeof(*hier)));
		return nil;
	}
	hier->interpolator = AnimInterpolator::create(numNodes, maxKeySize);

	hier->numNodes = numNodes;
	hier->flags = flags;
	hier->parentFrame = nil;
	hier->parentHierarchy = hier;
	if(hier->flags & NOMATRICES){
		hier->matrices = nil;
		hier->matricesUnaligned = nil;
	}else{
		hier->matricesUnaligned = rwNew(hier->numNodes*64 + 0xF, MEMDUR_EVENT | ID_HANIM);
		hier->matrices =
		  (Matrix*)(((uintptr)hier->matricesUnaligned + 0xF) & ~0xF);
	}
	hier->nodeInfo = rwNewT(HAnimNodeInfo, hier->numNodes, MEMDUR_EVENT | ID_HANIM);
	for(int32 i = 0; i < hier->numNodes; i++){
		if(nodeIDs)
			hier->nodeInfo[i].id = nodeIDs[i];
		else
			hier->nodeInfo[i].id = 0;
		hier->nodeInfo[i].index = i;
		if(nodeFlags)
			hier->nodeInfo[i].flags = nodeFlags[i];
		else
			hier->nodeInfo[i].flags = 0;
		hier->nodeInfo[i].frame = nil;
	}
	return hier;
}